

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void DPSprite::NewTick(void)

{
  DPSprite *local_18;
  DPSprite *pspr;
  int i;
  
  for (pspr._4_4_ = 0; pspr._4_4_ < 8; pspr._4_4_ = pspr._4_4_ + 1) {
    if ((playeringame[pspr._4_4_] & 1U) != 0) {
      for (local_18 = ::TObjPtr::operator_cast_to_DPSprite_
                                ((TObjPtr *)((long)pspr._4_4_ * 0x2a0 + 0xd63540));
          local_18 != (DPSprite *)0x0;
          local_18 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&local_18->Next)) {
        local_18->processPending = true;
        local_18->oldx = local_18->x;
        local_18->oldy = local_18->y;
      }
    }
  }
  return;
}

Assistant:

void DPSprite::NewTick()
{
	// This function should be called after the beginning of a tick, before any possible
	// prprite-event, or near the end, after any possible psprite event.
	// Because data is reset for every tick (which it must be) this has no impact on savegames.
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			DPSprite *pspr = players[i].psprites;
			while (pspr)
			{
				pspr->processPending = true;
				pspr->oldx = pspr->x;
				pspr->oldy = pspr->y;

				pspr = pspr->Next;
			}
		}
	}
}